

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void __thiscall
clip_model_loader::get_u32(clip_model_loader *this,string *key,int *output,bool required)

{
  int iVar1;
  undefined4 uVar2;
  pointer pgVar3;
  undefined8 uVar4;
  runtime_error *this_00;
  undefined1 in_CL;
  char *in_RDX;
  unique_ptr<gguf_context,_gguf_context_deleter> *in_RDI;
  int i;
  string local_40 [32];
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar5;
  
  uVar5 = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  pgVar3 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get(in_RDI);
  uVar4 = std::__cxx11::string::c_str();
  iVar1 = gguf_find_key(pgVar3,uVar4);
  if (iVar1 < 0) {
    if ((uVar5 & 0x1000000) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(in_RDX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(uVar5,iVar1));
      std::runtime_error::runtime_error(this_00,local_40);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pgVar3 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get(in_RDI);
    uVar2 = gguf_get_val_u32(pgVar3,(long)iVar1);
    *(undefined4 *)in_RDX = uVar2;
  }
  return;
}

Assistant:

void get_u32(const std::string & key, int & output, bool required = true) {
        const int i = gguf_find_key(ctx_gguf.get(), key.c_str());
        if (i < 0) {
            if (required) throw std::runtime_error("Key not found: " + key);
            return;
        }
        output = gguf_get_val_u32(ctx_gguf.get(), i);
    }